

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTestResults.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26dba::TestRecordsNumbersOfTests::RunImpl(TestRecordsNumbersOfTests *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_60;
  int local_3c [5];
  undefined1 local_28 [8];
  TestResults results;
  TestRecordsNumbersOfTests *this_local;
  
  results._16_8_ = this;
  UnitTest::TestResults::TestResults((TestResults *)local_28,(TestReporter *)0x0);
  UnitTest::TestResults::OnTestStart
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details);
  UnitTest::TestResults::OnTestStart
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details);
  UnitTest::TestResults::OnTestStart
            ((TestResults *)local_28,(TestDetails *)(anonymous_namespace)::details);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_3c[1] = 3;
  local_3c[0] = UnitTest::TestResults::GetTotalTestCount((TestResults *)local_28);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_60,*ppTVar2,0x18);
  UnitTest::CheckEqual<int,int>(results_00,local_3c + 1,local_3c,&local_60);
  return;
}

Assistant:

TEST(RecordsNumbersOfTests)
{
    TestResults results;
    results.OnTestStart(details);
    results.OnTestStart(details);
    results.OnTestStart(details);
    CHECK_EQUAL(3, results.GetTotalTestCount());
}